

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilsFORTRAN_wrap.cxx
# Opt level: O0

void msleep(int ms)

{
  domain_error *this;
  duration<long,_std::ratio<1L,_1000L>_> local_28 [3];
  int local_c [2];
  int ms_local;
  
  local_c[0] = ms;
  if (ms < 0) {
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this,"Invalid sleep time");
    __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)local_28,local_c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_28);
  return;
}

Assistant:

void msleep(int ms) {
    if (ms < 0)
        throw std::domain_error("Invalid sleep time");
    std::this_thread::sleep_for(std::chrono::milliseconds(ms));
}